

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# putkey.c
# Opt level: O0

int ffcrim(fitsfile *fptr,int bitpix,int naxis,long *naxes,int *status)

{
  int *in_RDI;
  fitsfile *in_R8;
  LONGLONG in_stack_00000080;
  long *in_stack_00000088;
  int in_stack_00000094;
  int in_stack_00000098;
  int in_stack_0000009c;
  fitsfile *in_stack_000000a0;
  LONGLONG in_stack_000000b0;
  int in_stack_000000b8;
  int *in_stack_000000c0;
  int *in_stack_ffffffffffffffd0;
  int local_4;
  
  if (in_R8->HDUposition < 1) {
    if (*in_RDI != *(int *)(*(long *)(in_RDI + 2) + 0x54)) {
      ffmahd(fptr,bitpix,(int *)naxes,status);
    }
    if (*(long *)(*(long *)(in_RDI + 2) + 0x70) !=
        *(long *)(*(long *)(*(long *)(in_RDI + 2) + 0x68) +
                 (long)*(int *)(*(long *)(in_RDI + 2) + 0x54) * 8)) {
      ffcrhd(in_R8,in_stack_ffffffffffffffd0);
    }
    ffphpr(in_stack_000000a0,in_stack_0000009c,in_stack_00000098,in_stack_00000094,in_stack_00000088
           ,in_stack_00000080,in_stack_000000b0,in_stack_000000b8,in_stack_000000c0);
    local_4 = in_R8->HDUposition;
  }
  else {
    local_4 = in_R8->HDUposition;
  }
  return local_4;
}

Assistant:

int ffcrim(fitsfile *fptr,      /* I - FITS file pointer           */
           int bitpix,          /* I - bits per pixel              */
           int naxis,           /* I - number of axes in the array */
           long *naxes,         /* I - size of each axis           */
           int *status)         /* IO - error status               */
/*
  create an IMAGE extension following the current HDU. If the
  current HDU is empty (contains no header keywords), then simply
  write the required image (or primary array) keywords to the current
  HDU. 
*/
{
    if (*status > 0)
        return(*status);

    if (fptr->HDUposition != (fptr->Fptr)->curhdu)
        ffmahd(fptr, (fptr->HDUposition) + 1, NULL, status);

    /* create new extension if current header is not empty */
    if ((fptr->Fptr)->headend != (fptr->Fptr)->headstart[(fptr->Fptr)->curhdu] )
        ffcrhd(fptr, status);

    /* write the required header keywords */
    ffphpr(fptr, TRUE, bitpix, naxis, naxes, 0, 1, TRUE, status);

    return(*status);
}